

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O1

bool CheckWildcards(char *pattern,char *text)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pattern_00;
  char *pcVar4;
  bool bVar5;
  
  if (text != (char *)0x0 && pattern != (char *)0x0) {
    do {
      for (; cVar1 = *pattern, cVar1 != '*'; pattern = pattern + 1) {
        if (cVar1 != '?') {
          if (cVar1 == '\0') {
            return *text == '\0';
          }
          iVar2 = tolower((int)cVar1);
          iVar3 = tolower((int)*text);
          if (iVar2 != iVar3) {
            return false;
          }
        }
        text = text + 1;
      }
      pattern_00 = pattern + 1;
      iVar2 = tolower((int)pattern[1]);
      cVar1 = *text;
      bVar5 = cVar1 == '\0';
      if (bVar5) {
LAB_0047f05a:
        bVar5 = true;
        pcVar4 = text;
        pattern = pattern_00;
      }
      else {
        iVar3 = tolower((int)cVar1);
        while (iVar3 != (char)iVar2) {
          pcVar4 = text + 1;
          cVar1 = *pcVar4;
          bVar5 = cVar1 == '\0';
          if (bVar5) {
            bVar5 = true;
            pattern = pattern_00;
            goto LAB_0047f065;
          }
          iVar3 = tolower((int)cVar1);
          text = pcVar4;
        }
        if ((bVar5) || (iVar3 = tolower((int)cVar1), iVar3 != (char)iVar2)) goto LAB_0047f05a;
        pcVar4 = text + 1;
        bVar5 = CheckWildcards(pattern_00,text);
        if (!bVar5) {
          pattern_00 = pattern;
        }
        bVar5 = !bVar5;
        pattern = pattern_00;
      }
LAB_0047f065:
      text = pcVar4;
    } while (bVar5);
  }
  return true;
}

Assistant:

bool CheckWildcards (const char *pattern, const char *text)
{
	if (pattern == NULL || text == NULL)
		return true;

	while (*pattern)
	{
		if (*pattern == '*')
		{
			char stop = tolower (*++pattern);
			while (*text && tolower(*text) != stop)
			{
				text++;
			}
			if (*text && tolower(*text) == stop)
			{
				if (CheckWildcards (pattern, text++))
				{
					return true;
				}
				pattern--;
			}
		}
		else if (*pattern == '?' || tolower(*pattern) == tolower(*text))
		{
			pattern++;
			text++;
		}
		else
		{
			return false;
		}
	}
	return (*pattern | *text) == 0;
}